

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata_impl.h
# Opt level: O0

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
::detach(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
         *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
  *p;
  totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
  *in_RDI;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
  copy;
  QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
  *in_stack_ffffffffffffffa8;
  QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Qt::totally_ordered_wrapper::operator_cast_to_bool
                    ((totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
                      *)0x759d5a);
  if (bVar2) {
    Qt::
    totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
    ::operator->((totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
                  *)0x759da5);
    iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x759dad);
    if (iVar3 != 1) {
      operator_new(0x38);
      Qt::
      totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
      ::
      operator*<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>,_true>
                ((totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
                  *)0x759de3);
      QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
      ::QMapData(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                  *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      swap((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
            *)in_stack_ffffffffffffffb0,
           (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
            *)in_stack_ffffffffffffffa8);
      ~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                  *)in_stack_ffffffffffffffb0);
    }
  }
  else {
    p = (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
         *)operator_new(0x38);
    QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
    ::QMapData(in_stack_ffffffffffffffb0);
    Qt::
    totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
    ::reset(in_RDI,p);
    Qt::
    totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
    ::operator->((totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
                  *)0x759d8e);
    QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)in_stack_ffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void detach()
    {
        if (!d) {
            // should this codepath be here on in all user's detach()?
            d.reset(new T);
            d->ref.ref();
        } else if (d->ref.loadRelaxed() != 1) {
            // TODO: qAtomicDetach here...?
            QExplicitlySharedDataPointerV2 copy(new T(*d));
            swap(copy);
        }
    }